

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall Bstrlib::CBString::writeallow(CBString *this)

{
  CBStringException *this_00;
  allocator local_59;
  string local_58;
  undefined1 local_38 [8];
  CBStringException bstr__cppwrapper_exception;
  CBString *this_local;
  
  if ((this->super_tagbstring).mlen == -1) {
    (this->super_tagbstring).mlen =
         (this->super_tagbstring).slen + (uint)((this->super_tagbstring).slen == 0);
  }
  else if ((this->super_tagbstring).mlen < 0) {
    bstr__cppwrapper_exception.msg.field_2._8_8_ = this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_58,"CBString::Cannot unprotect a constant",&local_59);
    CBStringException::CBStringException((CBStringException *)local_38,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(this_00,(CBStringException *)local_38);
    __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  return;
}

Assistant:

void CBString::writeallow () {
	if (mlen == -1) mlen = slen + (slen == 0);
	else if (mlen < 0) {
		bstringThrow ("Cannot unprotect a constant");
	}
}